

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O0

Joint * __thiscall RigidBodyDynamics::Joint::operator=(Joint *this,Joint *joint)

{
  undefined1 auVar1 [16];
  SpatialVector *pSVar2;
  ulong uVar3;
  ulong uVar4;
  SpatialVector *pSVar5;
  Joint *in_RSI;
  Joint *in_RDI;
  uint i;
  SpatialVector_t *in_stack_ffffffffffffff98;
  SpatialVector *in_stack_ffffffffffffffa0;
  SpatialVector *local_50;
  uint local_20;
  
  if (in_RDI != in_RSI) {
    local_50 = in_stack_ffffffffffffffa0;
    if ((in_RDI->mDoFCount != 0) && (in_RDI->mJointAxes != (SpatialVector *)0x0)) {
      operator_delete__(in_RDI->mJointAxes);
      local_50 = in_stack_ffffffffffffffa0;
    }
    in_RDI->mJointType = in_RSI->mJointType;
    in_RDI->mDoFCount = in_RSI->mDoFCount;
    uVar3 = CONCAT44(0,in_RDI->mDoFCount);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0x30),0);
    if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pSVar5 = (SpatialVector *)operator_new__(uVar4);
    if (uVar3 != 0) {
      pSVar2 = pSVar5;
      do {
        local_50 = pSVar2;
        SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x23e4f6);
        pSVar2 = local_50 + 1;
      } while (local_50 + 1 != pSVar5 + uVar3);
    }
    in_RDI->mJointAxes = pSVar5;
    for (local_20 = 0; local_20 < in_RDI->mDoFCount; local_20 = local_20 + 1) {
      SpatialVector_t::operator=(local_50,in_stack_ffffffffffffff98);
    }
    in_RDI->q_index = in_RSI->q_index;
  }
  return in_RDI;
}

Assistant:

Joint& operator= (const Joint &joint) {
		if (this != &joint) {
			if (mDoFCount > 0) {
				assert (mJointAxes);
				delete[] mJointAxes;
			}
			mJointType = joint.mJointType;
			mDoFCount = joint.mDoFCount;

			mJointAxes = new Math::SpatialVector[mDoFCount];

			for (unsigned int i = 0; i < mDoFCount; i++)
				mJointAxes[i] = joint.mJointAxes[i];

			q_index = joint.q_index;
		}
		return *this;
	}